

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_interactive.cpp
# Opt level: O2

void ftxui::anon_unknown_0::EventListener(atomic<bool> *quit,Sender<Event> *out)

{
  char *pcVar1;
  uint __i;
  int __fd;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  _Head_base<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_false> local_108;
  atomic<bool> *local_100;
  timeval tv;
  TerminalInputParser parser;
  char buff [100];
  
  local_108._M_head_impl =
       (out->_M_t).
       super___uniq_ptr_impl<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
       .super__Head_base<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_false>._M_head_impl;
  (out->_M_t).
  super___uniq_ptr_impl<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
  .super__Head_base<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_false>._M_head_impl =
       (SenderImpl<ftxui::Event> *)0x0;
  TerminalInputParser::TerminalInputParser(&parser,(Sender<Event> *)&local_108);
  std::
  unique_ptr<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
  ::~unique_ptr((unique_ptr<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
                 *)&local_108);
  local_100 = quit;
  while (((quit->_M_base)._M_i & 1U) == 0) {
    tv.tv_sec = 0;
    tv.tv_usec = 20000;
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      pcVar1 = buff + lVar2 * 8;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
    }
    buff[0] = buff[0] | 1;
    ::select(1,(fd_set *)buff,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&tv);
    if ((buff[0] & 1U) == 0) {
      TerminalInputParser::Timeout(&parser,0x14);
    }
    else {
      __fd = fileno(_stdin);
      uVar3 = read(__fd,(fd_set *)buff,100);
      uVar4 = uVar3 & 0xffffffff;
      if ((int)uVar3 < 1) {
        uVar4 = 0;
      }
      for (uVar3 = 0; quit = local_100, uVar4 != uVar3; uVar3 = uVar3 + 1) {
        TerminalInputParser::Add(&parser,buff[uVar3]);
      }
    }
  }
  TerminalInputParser::~TerminalInputParser(&parser);
  return;
}

Assistant:

void EventListener(std::atomic<bool>* quit, Sender<Event> out) {
  const int buffer_size = 100;

  auto parser = TerminalInputParser(std::move(out));

  while (!*quit) {
    if (!CheckStdinReady(timeout_microseconds)) {
      parser.Timeout(timeout_milliseconds);
      continue;
    }

    char buff[buffer_size];
    int l = read(fileno(stdin), buff, buffer_size);
    for (int i = 0; i < l; ++i)
      parser.Add(buff[i]);
  }
}